

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

ParamGenerator<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>_>
 __thiscall testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  element_type *extraout_RAX;
  allocator_type *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 *in_RSI;
  __shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>_>,_(__gnu_cxx::_Lock_policy)2>
  _Var1;
  initializer_list<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>_>
  __l;
  vector<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>,_std::allocator<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>_>_>
  local_60;
  TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>
  local_48;
  
  local_48._0_8_ = *in_RSI;
  local_48._8_8_ = in_RSI[1];
  local_48._16_8_ = in_RSI[2];
  local_48._36_8_ = *(undefined8 *)((long)in_RSI + 0x24);
  local_48.bit_depth = (aom_bit_depth_t)((ulong)*(undefined8 *)((long)in_RSI + 0x1c) >> 0x20);
  local_48.func._0_4_ = (undefined4)in_RSI[3];
  local_48.func._4_4_ = (undefined4)((ulong)in_RSI[3] >> 0x20);
  __l._M_len = 1;
  __l._M_array = &local_48;
  std::
  vector<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>,_std::allocator<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>_>_>
  ::vector(&local_60,__l,in_RCX);
  _Var1 = (__shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>_>,_(__gnu_cxx::_Lock_policy)2>
           )ValuesIn<std::vector<(anonymous_namespace)::TestParams<unsigned_int(*)(unsigned_char_const*,int,unsigned_char_const*,int,unsigned_int*)>,std::allocator<(anonymous_namespace)::TestParams<unsigned_int(*)(unsigned_char_const*,int,unsigned_char_const*,int,unsigned_int*)>>>>
                      ((vector<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>,_std::allocator<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>_>_>
                        *)this);
  if (local_60.
      super__Vector_base<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>,_std::allocator<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>,_std::allocator<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    _Var1._M_refcount._M_pi = extraout_RDX._M_pi;
    _Var1._M_ptr = extraout_RAX;
  }
  return (shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>_>_>
          )(shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParams<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>_>_>
            )_Var1;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }